

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

box3f * __thiscall pbrt::Instance::getBounds(Instance *this)

{
  undefined8 uVar1;
  bool bVar2;
  element_type *peVar3;
  vec3f *p;
  vec3f *p_00;
  long in_RSI;
  box3f *in_RDI;
  float fVar4;
  float fVar5;
  vec3f vVar6;
  box3f _bounds;
  box3f ob;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  vec3f *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  vec3f *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  vec3f local_1bc;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  vec3f local_18c;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  float local_168;
  vec3f local_15c;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  vec3f local_12c;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  vec3f local_fc;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  vec3f local_cc;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  vec3f local_9c;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  vec3f local_6c;
  undefined8 local_60;
  float local_58;
  undefined8 local_54;
  undefined8 local_4c;
  undefined8 local_44;
  box3f local_2c;
  undefined4 local_14;
  
  if ((*(byte *)(in_RSI + 0x80) & 1) == 0) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               in_stack_fffffffffffffd08);
    if ((*(byte *)(in_RSI + 0x80) & 1) == 0) {
      peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21a928);
      (*(peVar3->super_Entity)._vptr_Entity[3])(&local_2c);
      bVar2 = math::box3f::empty(&local_2c);
      if (bVar2) {
        *(ulong *)(in_RSI + 0x84) = CONCAT44(local_2c.lower.y,local_2c.lower.x);
        *(ulong *)(in_RSI + 0x8c) = CONCAT44(local_2c.upper.x,local_2c.lower.z);
        *(ulong *)(in_RSI + 0x94) = CONCAT44(local_2c.upper.z,local_2c.upper.y);
        *(undefined1 *)(in_RSI + 0x80) = 1;
        (in_RDI->lower).x = local_2c.lower.x;
        (in_RDI->lower).y = local_2c.lower.y;
        *(ulong *)&(in_RDI->lower).z = CONCAT44(local_2c.upper.x,local_2c.lower.z);
        (in_RDI->upper).y = local_2c.upper.y;
        (in_RDI->upper).z = local_2c.upper.z;
      }
      else {
        math::box3f::empty_box();
        math::vec3f::vec3f(&local_6c,local_2c.lower.x,local_2c.lower.y,local_2c.lower.z);
        vVar6 = math::xfmPoint((affine3f *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               in_stack_fffffffffffffd28);
        local_78 = vVar6.z;
        local_80 = vVar6._0_8_;
        local_60 = local_80;
        local_58 = local_78;
        math::box3f::extend((box3f *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                            in_stack_fffffffffffffd48);
        math::vec3f::vec3f(&local_9c,local_2c.lower.x,local_2c.lower.y,local_2c.upper.z);
        vVar6 = math::xfmPoint((affine3f *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               in_stack_fffffffffffffd28);
        local_a8 = vVar6.z;
        local_b0 = vVar6._0_8_;
        local_90 = local_b0;
        local_88 = local_a8;
        math::box3f::extend((box3f *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                            in_stack_fffffffffffffd48);
        math::vec3f::vec3f(&local_cc,local_2c.lower.x,local_2c.upper.y,local_2c.lower.z);
        vVar6 = math::xfmPoint((affine3f *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               in_stack_fffffffffffffd28);
        local_d8 = vVar6.z;
        local_e0 = vVar6._0_8_;
        local_c0 = local_e0;
        local_b8 = local_d8;
        math::box3f::extend((box3f *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                            in_stack_fffffffffffffd48);
        math::vec3f::vec3f(&local_fc,local_2c.lower.x,local_2c.upper.y,local_2c.upper.z);
        vVar6 = math::xfmPoint((affine3f *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               in_stack_fffffffffffffd28);
        local_108 = vVar6.z;
        local_110 = vVar6._0_8_;
        local_f0 = local_110;
        local_e8 = local_108;
        math::box3f::extend((box3f *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                            in_stack_fffffffffffffd48);
        math::vec3f::vec3f(&local_12c,local_2c.upper.x,local_2c.lower.y,local_2c.lower.z);
        vVar6 = math::xfmPoint((affine3f *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               in_stack_fffffffffffffd28);
        local_138 = vVar6.z;
        local_140 = vVar6._0_8_;
        local_120 = local_140;
        local_118 = local_138;
        math::box3f::extend((box3f *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                            in_stack_fffffffffffffd48);
        math::vec3f::vec3f(&local_15c,local_2c.upper.x,local_2c.lower.y,local_2c.upper.z);
        vVar6 = math::xfmPoint((affine3f *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               in_stack_fffffffffffffd28);
        fVar4 = vVar6.z;
        local_170 = vVar6._0_8_;
        local_168 = fVar4;
        local_150 = local_170;
        local_148 = fVar4;
        math::box3f::extend((box3f *)CONCAT44(fVar4,in_stack_fffffffffffffd50),
                            in_stack_fffffffffffffd48);
        p = (vec3f *)(in_RSI + 0x28);
        math::vec3f::vec3f(&local_18c,local_2c.upper.x,local_2c.upper.y,local_2c.lower.z);
        vVar6 = math::xfmPoint((affine3f *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               in_stack_fffffffffffffd28);
        fVar5 = vVar6.z;
        local_1a0 = vVar6._0_8_;
        local_198 = fVar5;
        local_180 = local_1a0;
        local_178 = fVar5;
        math::box3f::extend((box3f *)CONCAT44(fVar4,in_stack_fffffffffffffd50),p);
        p_00 = (vec3f *)(in_RSI + 0x28);
        math::vec3f::vec3f(&local_1bc,local_2c.upper.x,local_2c.upper.y,local_2c.upper.z);
        vVar6 = math::xfmPoint((affine3f *)CONCAT44(fVar5,in_stack_fffffffffffffd30),p_00);
        local_1a8 = vVar6.z;
        local_1b0 = vVar6._0_8_;
        math::box3f::extend((box3f *)CONCAT44(fVar4,in_stack_fffffffffffffd50),p);
        *(undefined8 *)(in_RSI + 0x84) = local_54;
        *(undefined8 *)(in_RSI + 0x8c) = local_4c;
        *(undefined8 *)(in_RSI + 0x94) = local_44;
        *(undefined1 *)(in_RSI + 0x80) = 1;
        uVar1 = *(undefined8 *)(in_RSI + 0x84);
        (in_RDI->lower).x = (float)(int)uVar1;
        (in_RDI->lower).y = (float)(int)((ulong)uVar1 >> 0x20);
        *(undefined8 *)&(in_RDI->lower).z = *(undefined8 *)(in_RSI + 0x8c);
        uVar1 = *(undefined8 *)(in_RSI + 0x94);
        (in_RDI->upper).y = (float)(int)uVar1;
        (in_RDI->upper).z = (float)(int)((ulong)uVar1 >> 0x20);
      }
    }
    else {
      uVar1 = *(undefined8 *)(in_RSI + 0x84);
      (in_RDI->lower).x = (float)(int)uVar1;
      (in_RDI->lower).y = (float)(int)((ulong)uVar1 >> 0x20);
      *(undefined8 *)&(in_RDI->lower).z = *(undefined8 *)(in_RSI + 0x8c);
      uVar1 = *(undefined8 *)(in_RSI + 0x94);
      (in_RDI->upper).y = (float)(int)uVar1;
      (in_RDI->upper).z = (float)(int)((ulong)uVar1 >> 0x20);
    }
    local_14 = 1;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21b03a);
  }
  else {
    uVar1 = *(undefined8 *)(in_RSI + 0x84);
    (in_RDI->lower).x = (float)(int)uVar1;
    (in_RDI->lower).y = (float)(int)((ulong)uVar1 >> 0x20);
    *(undefined8 *)&(in_RDI->lower).z = *(undefined8 *)(in_RSI + 0x8c);
    uVar1 = *(undefined8 *)(in_RSI + 0x94);
    (in_RDI->upper).y = (float)(int)uVar1;
    (in_RDI->upper).z = (float)(int)((ulong)uVar1 >> 0x20);
  }
  return in_RDI;
}

Assistant:

box3f Instance::getBounds() 
  {
    assert(object);
    
    if (haveComputedBounds) return bounds;

    std::lock_guard<std::mutex> lock(mutex);
    if (haveComputedBounds) return bounds;
    const box3f ob = object->getBounds();
    if (ob.empty()) {
      this->bounds = ob;
      haveComputedBounds = true;
      return ob;
    }

    box3f _bounds = box3f::empty_box();
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    this->bounds = _bounds;
    haveComputedBounds = true;
    return bounds;
  }